

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  weighted_vec *pwVar7;
  uint64 uVar8;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *other;
  uint *puVar9;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *local_2a0;
  vector<unsigned_int> *local_288;
  vector<unsigned_int> *local_168;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *local_140;
  uint local_134;
  uint j;
  vector<unsigned_int> *indices;
  uint i;
  uint first_cluster;
  vector<crnlib::vector<unsigned_int>_> block_type_selector_cluster_indices;
  uint local_100;
  uint max_clusters;
  uint block_type_1;
  uint weight;
  uint cMaxWeight;
  uint cAlphaDistToWeight;
  int dist;
  int high_alpha;
  int low_alpha;
  float f;
  uint s;
  uint x;
  uint y;
  bool uses_absolute_values;
  float *pDst;
  vec16F sv;
  dxt5_block *dxt5_block;
  uint block_iter;
  uint block_type;
  vector<unsigned_int> selector_vec_remap [2];
  undefined1 local_48 [8];
  weighted_selector_vec_array selector_vecs [2];
  vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices_local;
  uint max_selector_clusters_local;
  qdxt5 *this_local;
  
  local_140 = (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
              local_48;
  selector_vecs[1]._8_8_ = selector_cluster_indices;
  do {
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::vector(local_140);
    local_140 = local_140 + 1;
  } while (local_140 !=
           (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
           &selector_vecs[1].m_size);
  local_168 = (vector<unsigned_int> *)&block_iter;
  do {
    vector<unsigned_int>::vector(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (vector<unsigned_int> *)&selector_vec_remap[1].m_size);
  for (dxt5_block._4_4_ = 0; dxt5_block._4_4_ < 2; dxt5_block._4_4_ = dxt5_block._4_4_ + 1) {
    for (dxt5_block._0_4_ = 0; (uint)dxt5_block < this->m_num_blocks;
        dxt5_block._0_4_ = (uint)dxt5_block + 1) {
      sv.m_s._56_8_ = get_block(this,(uint)dxt5_block);
      bVar1 = crnlib::dxt5_block::is_alpha6_block((dxt5_block *)sv.m_s._56_8_);
      if (bVar1 == dxt5_block._4_4_) {
        vec<16U,_float>::vec((vec<16U,_float> *)&pDst);
        _y = vec<16U,_float>::operator[]((vec<16U,_float> *)&pDst,0);
        bVar1 = false;
        for (s = 0; s < 4; s = s + 1) {
          for (f = 0.0; (uint)f < 4; f = (float)((int)f + 1)) {
            uVar3 = crnlib::dxt5_block::get_selector((dxt5_block *)sv.m_s._56_8_,(uint)f,s);
            bVar2 = crnlib::dxt5_block::is_alpha6_block((dxt5_block *)sv.m_s._56_8_);
            if (bVar2) {
              if (uVar3 < 6) {
                high_alpha = (int)(float)*(byte *)((long)&g_dxt5_alpha6_to_linear + (ulong)uVar3);
              }
              else {
                bVar1 = true;
                high_alpha = 0;
              }
            }
            else {
              high_alpha = (int)(float)*(byte *)((long)&g_dxt5_to_linear + (ulong)uVar3);
            }
            *_y = (float)high_alpha;
            _y = _y + 1;
          }
        }
        if (!bVar1) {
          uVar3 = crnlib::dxt5_block::get_low_alpha((dxt5_block *)sv.m_s._56_8_);
          uVar4 = crnlib::dxt5_block::get_high_alpha((dxt5_block *)sv.m_s._56_8_);
          uVar5 = math::square<int>(uVar3 - uVar4);
          uVar5 = math::clamp<unsigned_int>(uVar5 >> 3,1,0x800);
          uVar6 = (ulong)dxt5_block._4_4_;
          uVar3 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                            ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                              *)&selector_vecs[uVar6 - 1].m_size);
          vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::resize
                    ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *
                     )&selector_vecs[uVar6 - 1].m_size,uVar3 + 1,false);
          pwVar7 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
                   back((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)&selector_vecs[(ulong)dxt5_block._4_4_ - 1].m_size);
          vec<16U,_float>::operator=(&pwVar7->m_vec,(vec<16U,_float> *)&pDst);
          pwVar7 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
                   back((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)&selector_vecs[(ulong)dxt5_block._4_4_ - 1].m_size);
          pwVar7->m_weight = uVar5;
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)(&block_iter + (ulong)dxt5_block._4_4_ * 4),
                     (uint *)&dxt5_block);
        }
      }
    }
  }
  vector<crnlib::vector<unsigned_int>_>::clear
            ((vector<crnlib::vector<unsigned_int>_> *)selector_vecs[1]._8_8_);
  for (local_100 = 0; local_100 < 2; local_100 = local_100 + 1) {
    bVar1 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::empty
                      ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                        *)&selector_vecs[(ulong)local_100 - 1].m_size);
    if ((!bVar1) &&
       (uVar3 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                          ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                            *)&selector_vecs[(ulong)local_100 - 1].m_size),
       0.01 <= (float)uVar3 / (float)this->m_num_blocks)) {
      uVar3 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)&selector_vecs[(ulong)local_100 - 1].m_size);
      uVar8 = math::emulu(uVar3,max_selector_clusters);
      block_type_selector_cluster_indices.m_capacity =
           (uint)((uVar8 + (this->m_num_blocks - 1)) / (ulong)this->m_num_blocks);
      uVar5 = math::maximum<unsigned_int>(0x40,block_type_selector_cluster_indices.m_capacity);
      uVar3 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)&selector_vecs[(ulong)local_100 - 1].m_size);
      uVar5 = math::minimum<unsigned_int>(uVar5,uVar3);
      block_type_selector_cluster_indices.m_capacity = uVar5;
      uVar3 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)&selector_vecs[(ulong)local_100 - 1].m_size);
      if (uVar5 < uVar3) {
        vector<crnlib::vector<unsigned_int>_>::vector
                  ((vector<crnlib::vector<unsigned_int>_> *)&first_cluster);
        if (local_100 == 0) {
          this->m_progress_start = this->m_progress_range;
          this->m_progress_range = 0x10;
        }
        else {
          this->m_progress_start = this->m_progress_range + 0x10;
          this->m_progress_range = 0x11;
        }
        bVar1 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                          (&this->m_selector_clusterizer,
                           (weighted_vec_array *)&selector_vecs[(ulong)local_100 - 1].m_size,
                           block_type_selector_cluster_indices.m_capacity,
                           (vector<crnlib::vector<unsigned_int>_> *)&first_cluster,
                           generate_codebook_progress_callback,this);
        if (bVar1) {
          uVar3 = vector<crnlib::vector<unsigned_int>_>::size
                            ((vector<crnlib::vector<unsigned_int>_> *)selector_vecs[1]._8_8_);
          this_00 = selector_vecs[1]._8_8_;
          uVar4 = vector<crnlib::vector<unsigned_int>_>::size
                            ((vector<crnlib::vector<unsigned_int>_> *)&first_cluster);
          vector<crnlib::vector<unsigned_int>_>::enlarge
                    ((vector<crnlib::vector<unsigned_int>_> *)this_00,uVar4);
          for (indices._4_4_ = 0;
              uVar4 = vector<crnlib::vector<unsigned_int>_>::size
                                ((vector<crnlib::vector<unsigned_int>_> *)&first_cluster),
              indices._4_4_ < uVar4; indices._4_4_ = indices._4_4_ + 1) {
            this_01 = vector<crnlib::vector<unsigned_int>_>::operator[]
                                ((vector<crnlib::vector<unsigned_int>_> *)selector_vecs[1]._8_8_,
                                 uVar3 + indices._4_4_);
            other = vector<crnlib::vector<unsigned_int>_>::operator[]
                              ((vector<crnlib::vector<unsigned_int>_> *)&first_cluster,indices._4_4_
                              );
            vector<unsigned_int>::swap(this_01,other);
            for (local_134 = 0; uVar4 = vector<unsigned_int>::size(this_01), local_134 < uVar4;
                local_134 = local_134 + 1) {
              puVar9 = vector<unsigned_int>::at(this_01,local_134);
              puVar9 = vector<unsigned_int>::operator[]
                                 ((vector<unsigned_int> *)(&block_iter + (ulong)local_100 * 4),
                                  *puVar9);
              uVar5 = *puVar9;
              puVar9 = vector<unsigned_int>::at(this_01,local_134);
              *puVar9 = uVar5;
            }
          }
          bVar1 = false;
        }
        else {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        vector<crnlib::vector<unsigned_int>_>::~vector
                  ((vector<crnlib::vector<unsigned_int>_> *)&first_cluster);
        if (bVar1) goto LAB_0016b4f7;
      }
    }
  }
  this_local._7_1_ = 1;
LAB_0016b4f7:
  local_288 = (vector<unsigned_int> *)&selector_vec_remap[1].m_size;
  do {
    local_288 = local_288 + -1;
    vector<unsigned_int>::~vector(local_288);
  } while (local_288 != (vector<unsigned_int> *)&block_iter);
  local_2a0 = (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
              &selector_vecs[1].m_size;
  do {
    local_2a0 = local_2a0 + -1;
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::~vector(local_2a0)
    ;
  } while (local_2a0 !=
           (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)local_48)
  ;
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        weighted_selector_vec_array selector_vecs[2];
        crnlib::vector<uint> selector_vec_remap[2];

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
            {
                dxt5_block& dxt5_block = get_block(block_iter);
                if ((uint)dxt5_block.is_alpha6_block() != block_type)
                {
                    continue;
                }

                vec16F sv;
                float* pDst = &sv[0];

                bool uses_absolute_values = false;

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        const uint s = dxt5_block.get_selector(x, y);

                        float f;
                        if (dxt5_block.is_alpha6_block())
                        {
                            if (s >= 6)
                            {
                                uses_absolute_values = true;
                                f = 0.0f;
                            }
                            else
                            {
                                f = g_dxt5_alpha6_to_linear[s];
                            }
                        }
                        else
                        {
                            f = g_dxt5_to_linear[s];
                        }

                        *pDst++ = f;
                    }
                }

                if (uses_absolute_values)
                {
                    continue;
                }

                int low_alpha = dxt5_block.get_low_alpha();
                int high_alpha = dxt5_block.get_high_alpha();
                int dist = math::square(low_alpha - high_alpha);

                const uint cAlphaDistToWeight = 8;
                const uint cMaxWeight = 2048;
                uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

                selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
                selector_vecs[block_type].back().m_vec = sv;
                selector_vecs[block_type].back().m_weight = weight;

                selector_vec_remap[block_type].push_back(block_iter);
            }
        }

        selector_cluster_indices.clear();

        for (uint block_type = 0; block_type < 2; block_type++)
        {
            if (selector_vecs[block_type].empty())
            {
                continue;
            }

            if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
            {
                continue;
            }
            uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
            max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
            if (max_clusters >= selector_vecs[block_type].size())
            {
                continue;
            }

#if QDXT5_DEBUGGING
            trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

            crnlib::vector<crnlib::vector<uint>> block_type_selector_cluster_indices;

            if (!block_type)
            {
                m_progress_start = m_progress_range;
                m_progress_range = 16;
            }
            else
            {
                m_progress_start = m_progress_range + 16;
                m_progress_range = 17;
            }

            if (!m_selector_clusterizer.create_clusters(
                    selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this))
            {
                return false;
            }

            const uint first_cluster = selector_cluster_indices.size();
            selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

            for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++)
            {
                crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
                indices.swap(block_type_selector_cluster_indices[i]);

                for (uint j = 0; j < indices.size(); j++)
                {
                    indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
                }
            }
        }

        return true;
    }